

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O2

FUNCTION_RETURN getModuleName(char *buffer)

{
  uint uVar1;
  size_t sVar2;
  ssize_t sVar3;
  FUNCTION_RETURN FVar4;
  char pidStr [64];
  char proc_path [1024];
  char path [1024];
  
  FVar4 = FUNC_RET_OK;
  memset(path,0,0x400);
  uVar1 = getpid();
  sprintf(pidStr,"%d",(ulong)uVar1);
  builtin_strncpy(proc_path,"/proc/",7);
  strcat(proc_path,pidStr);
  sVar2 = strlen(proc_path);
  builtin_strncpy(proc_path + sVar2,"/exe",5);
  sVar3 = readlink(proc_path,path,0x3ff);
  if ((uint)sVar3 < 0x401) {
    license::mstrlcpy(buffer,path,(ulong)((uint)sVar3 + 1 & 0xfff));
  }
  else {
    FVar4 = FUNC_RET_ERROR;
  }
  return FVar4;
}

Assistant:

FUNCTION_RETURN getModuleName(char buffer[MAX_PATH]) {
	FUNCTION_RETURN result;
	char path[MAX_PATH] = {0};
	char proc_path[MAX_PATH], pidStr[64];
	pid_t pid = getpid();
	sprintf(pidStr, "%d", pid);
	strcpy(proc_path, "/proc/");
	strcat(proc_path, pidStr);
	strcat(proc_path, "/exe");

	int ch = readlink(proc_path, path, MAX_PATH - 1);
	if (ch > MAX_PATH || ch < 0) {
		result = FUNC_RET_ERROR;
	} else {
		mstrlcpy(buffer, path, ch + 1);
		result = FUNC_RET_OK;
	}
	return result;
}